

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch.hpp
# Opt level: O2

pair<boost::unit_test::basic_cstring<const_char>,_bool> *
boost::runtime::env::env_detail::sys_read_var
          (pair<boost::unit_test::basic_cstring<const_char>,_bool> *__return_storage_ptr__,
          cstring *var_name)

{
  char *s;
  basic_cstring<const_char> local_28;
  
  s = getenv(var_name->m_begin);
  unit_test::basic_cstring<const_char>::basic_cstring(&local_28,s);
  (__return_storage_ptr__->first).m_begin = local_28.m_begin;
  (__return_storage_ptr__->first).m_end = local_28.m_end;
  __return_storage_ptr__->second = s != (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<cstring,bool>
sys_read_var( cstring var_name )
{
    using namespace std;
    char const* res = getenv( var_name.begin() );

    return std::make_pair( cstring(res), res != NULL );
}